

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

int imagetopgx(opj_image_t *image,char *outfile)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  OPJ_UINT32 prec;
  uint uVar4;
  opj_image_comp_t *poVar5;
  char *__ptr;
  int iVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  FILE *__stream;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  size_t sStack_1b0;
  uchar byte;
  opj_image_t *local_198;
  opj_image_comp_t *local_190;
  char *local_188;
  ulong local_180;
  size_t local_178;
  ulong local_170;
  ulong local_168;
  uint local_15c;
  char *local_158;
  ulong local_150;
  long local_148;
  FILE *local_140;
  char bname [256];
  
  uVar12 = 0;
  local_198 = image;
  local_158 = outfile;
  while( true ) {
    pcVar9 = local_158;
    if (local_198->numcomps <= uVar12) {
      return 0;
    }
    local_190 = local_198->comps + uVar12;
    sVar8 = strlen(local_158);
    if (pcVar9[sVar8 - 4] != '.') break;
    uVar14 = sVar8 - 0xff;
    pcVar9 = bname;
    if ((uVar14 < 0xfffffffffffffeff) && (pcVar9 = (char *)malloc(sVar8 + 3), pcVar9 == (char *)0x0)
       ) {
      pcVar9 = "imagetopgx: memory out\n";
      sStack_1b0 = 0x17;
      goto LAB_001074ae;
    }
    memcpy(pcVar9,local_158,sVar8 - 4);
    local_150 = uVar12;
    sprintf(pcVar9 + (sVar8 - 4),"_%u.pgx",uVar12 & 0xffffffff);
    __stream = fopen(pcVar9,"wb");
    poVar5 = local_190;
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"ERROR -> failed to open %s for writing\n",pcVar9);
      if (0xfffffffffffffefe < uVar14) {
        return 1;
      }
      free(pcVar9);
      return 1;
    }
    uVar1 = local_198->comps[uVar12].w;
    bVar15 = local_190->sgnd != 0;
    uVar2 = local_198->comps[uVar12].h;
    local_180 = uVar14;
    fprintf(__stream,"PG ML %c %d %d %d\n",(ulong)(bVar15 + 0x2b + (uint)bVar15),
            (ulong)local_190->prec,(ulong)uVar1,(ulong)uVar2);
    uVar3 = poVar5->prec;
    uVar4 = (uint)(0x10 < uVar3) * 2 + 1;
    if (8 >= uVar3) {
      uVar4 = 0;
    }
    local_188 = pcVar9;
    if (8 < uVar3) {
      uVar3 = uVar2 * uVar1;
      if ((int)(uVar2 * uVar1) < 1) {
        uVar3 = 0;
      }
      local_170 = (ulong)uVar3;
      local_168 = CONCAT44(local_168._4_4_,uVar4 * 8);
      local_178 = (ulong)uVar4;
      for (uVar14 = 0; sVar8 = local_178, uVar14 != local_170; uVar14 = uVar14 + 1) {
        iVar7 = clamp(local_198->comps[uVar12].data[uVar14],local_190->prec,local_190->sgnd);
        iVar6 = (int)local_168;
        for (uVar11 = sVar8 & 0xffffffff; -1 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
          byte = (uchar)(iVar7 >> ((byte)iVar6 & 0x1f));
          sVar8 = fwrite(&byte,1,1,__stream);
          pcVar9 = local_188;
          if (sVar8 == 0) {
            fprintf(_stderr,"failed to write 1 byte for %s\n",local_188);
            goto joined_r0x001073f1;
          }
          iVar6 = iVar6 + -8;
        }
      }
    }
    else {
      sVar8 = (size_t)(int)uVar1;
      pcVar9 = (char *)malloc(sVar8);
      if (pcVar9 == (char *)0x0) {
        fwrite("Out of memory",0xd,1,_stderr);
        pcVar9 = local_188;
joined_r0x001073f1:
        if (local_180 < 0xfffffffffffffeff) {
LAB_001073f6:
          free(pcVar9);
        }
        fclose(__stream);
        return 1;
      }
      uVar14 = 0;
      if (0 < (int)uVar1) {
        uVar14 = (ulong)uVar1;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      local_170 = (ulong)uVar2;
      local_148 = sVar8 * 4;
      lVar13 = 0;
      uVar11 = 0;
      local_178 = sVar8;
      local_15c = uVar1;
      local_140 = __stream;
      while (uVar11 != local_170) {
        prec = local_190->prec;
        local_168 = uVar11;
        if ((prec == 8) && (local_190->sgnd == 0)) {
          for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
            iVar6 = *(int *)((long)local_198->comps[uVar12].data + uVar11 * 4 + lVar13);
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            pcVar9[uVar11] = (char)iVar6;
          }
        }
        else {
          for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
            iVar6 = clamp(*(int *)((long)local_198->comps[uVar12].data + uVar11 * 4 + lVar13),prec,
                          local_190->sgnd);
            pcVar9[uVar11] = (char)iVar6;
          }
        }
        __stream = local_140;
        sVar8 = local_178;
        sVar10 = fwrite(pcVar9,1,local_178,local_140);
        __ptr = local_188;
        uVar11 = local_168 + 1;
        lVar13 = lVar13 + local_148;
        if (sVar10 != sVar8) {
          fprintf(_stderr,"failed to write %d bytes for %s\n",(ulong)local_15c,local_188);
          if (local_180 < 0xfffffffffffffeff) {
            free(__ptr);
          }
          goto LAB_001073f6;
        }
      }
      free(pcVar9);
    }
    if (local_180 < 0xfffffffffffffeff) {
      free(local_188);
    }
    fclose(__stream);
    uVar12 = local_150 + 1;
  }
  pcVar9 = "ERROR -> Impossible happen.";
  sStack_1b0 = 0x1b;
LAB_001074ae:
  fwrite(pcVar9,sStack_1b0,1,_stderr);
  return 1;
}

Assistant:

int imagetopgx(opj_image_t * image, const char *outfile)
{
    int w, h;
    int i, j, fails = 1;
    unsigned int compno;
    FILE *fdest = NULL;

    for (compno = 0; compno < image->numcomps; compno++) {
        opj_image_comp_t *comp = &image->comps[compno];
        char bname[256]; /* buffer for name */
        char *name = bname; /* pointer */
        int nbytes = 0;
        size_t res;
        const size_t olen = strlen(outfile);
        const size_t dotpos = olen - 4;
        const size_t total = dotpos + 1 + 1 + 4; /* '-' + '[1-3]' + '.pgx' */

        if (outfile[dotpos] != '.') {
            /* `pgx` was recognized but there is no dot at expected position */
            fprintf(stderr, "ERROR -> Impossible happen.");
            goto fin;
        }
        if (total > 256) {
            name = (char*)malloc(total + 1);
            if (name == NULL) {
                fprintf(stderr, "imagetopgx: memory out\n");
                goto fin;
            }
        }
        memcpy(name, outfile, dotpos);
        sprintf(name + dotpos, "_%u.pgx", compno);
        fdest = fopen(name, "wb");
        /* don't need name anymore */

        if (!fdest) {

            fprintf(stderr, "ERROR -> failed to open %s for writing\n", name);
            if (total > 256) {
                free(name);
            }
            goto fin;
        }

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        fprintf(fdest, "PG ML %c %d %d %d\n", comp->sgnd ? '-' : '+', comp->prec,
                w, h);

        if (comp->prec <= 8) {
            nbytes = 1;
        } else if (comp->prec <= 16) {
            nbytes = 2;
        } else {
            nbytes = 4;
        }

        if (nbytes == 1) {
            unsigned char* line_buffer = malloc((size_t)w);
            if (line_buffer == NULL) {
                fprintf(stderr, "Out of memory");
                if (total > 256) {
                    free(name);
                }
                goto fin;
            }
            for (j = 0; j < h; j++) {
                if (comp->prec == 8 && comp->sgnd == 0) {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)CLAMP(image->comps[compno].data[j * w + i], 0,
                                                              255);
                    }
                } else {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)
                                         clamp(image->comps[compno].data[j * w + i],
                                               (int)comp->prec, (int)comp->sgnd);
                    }
                }
                res = fwrite(line_buffer, 1, (size_t)w, fdest);
                if (res != (size_t)w) {
                    fprintf(stderr, "failed to write %d bytes for %s\n", w, name);
                    if (total > 256) {
                        free(name);
                    }
                    free(line_buffer);
                    goto fin;
                }
            }
            free(line_buffer);
        } else {

            for (i = 0; i < w * h; i++) {
                /* FIXME: clamp func is being called within a loop */
                const int val = clamp(image->comps[compno].data[i],
                                      (int)comp->prec, (int)comp->sgnd);

                for (j = nbytes - 1; j >= 0; j--) {
                    int v = (int)(val >> (j * 8));
                    unsigned char byte = (unsigned char)v;
                    res = fwrite(&byte, 1, 1, fdest);

                    if (res < 1) {
                        fprintf(stderr, "failed to write 1 byte for %s\n", name);
                        if (total > 256) {
                            free(name);
                        }
                        goto fin;
                    }
                }
            }
        }

        if (total > 256) {
            free(name);
        }
        fclose(fdest);
        fdest = NULL;
    }
    fails = 0;
fin:
    if (fdest) {
        fclose(fdest);
    }

    return fails;
}